

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_http.c
# Opt level: O2

void mk_http_request_free(mk_http_request *sr,mk_server *server)

{
  mk_list *pmVar1;
  _func_void_mk_stream_ptr *p_Var2;
  mk_list *pmVar3;
  
  mk_vhost_close(sr,server);
  free((sr->headers).location);
  if ((sr->uri_processed).data != (sr->uri).data) {
    mk_ptr_free(&sr->uri_processed);
  }
  if ((sr->real_path).data != sr->real_path_static) {
    mk_ptr_free(&sr->real_path);
  }
  if ((sr->stream).channel != (mk_channel *)0x0) {
    pmVar3 = (sr->stream).inputs.next;
    while (pmVar3 != &(sr->stream).inputs) {
      pmVar1 = pmVar3->next;
      mk_stream_in_release((mk_stream_input *)&pmVar3[-5].next);
      pmVar3 = pmVar1;
    }
    p_Var2 = (sr->stream).cb_finished;
    if (p_Var2 != (_func_void_mk_stream_ptr *)0x0) {
      (*p_Var2)(&sr->stream);
    }
    (sr->stream).channel = (mk_channel *)0x0;
    pmVar3 = (sr->stream)._head.prev;
    pmVar1 = (sr->stream)._head.next;
    pmVar3->next = pmVar1;
    pmVar1->prev = pmVar3;
    (sr->stream)._head.prev = (mk_list *)0x0;
    (sr->stream)._head.next = (mk_list *)0x0;
    if ((sr->stream).dynamic == 1) {
      free(&sr->stream);
      return;
    }
  }
  return;
}

Assistant:

void mk_http_request_free(struct mk_http_request *sr, struct mk_server *server)
{
    /* Let the vhost interface to handle the session close */
    mk_vhost_close(sr, server);

    if (sr->headers.location) {
        mk_mem_free(sr->headers.location);
    }

    if (sr->uri_processed.data != sr->uri.data) {
        mk_ptr_free(&sr->uri_processed);
    }

    if (sr->real_path.data != sr->real_path_static) {
        mk_ptr_free(&sr->real_path);
    }

    if (sr->stream.channel) {
        mk_stream_release(&sr->stream);
    }
}